

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void myarima_summary(myarima_object obj)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  uint local_24;
  int mean;
  int ncxreg;
  int nd;
  int t;
  int pq;
  int i;
  myarima_object obj_local;
  
  iVar4 = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + obj->sarimax->Q + obj->sarimax->M;
  iVar2 = obj->sarimax->M;
  iVar3 = obj->sarimax->r;
  if ((obj->sarimax->method == 0) || (obj->sarimax->method == 1)) {
    printf("\n\nExit Status \n");
    printf("Return Code : %d \n",(ulong)(uint)obj->sarimax->retval);
    printf("Exit Message : ");
    if (obj->sarimax->retval == 0) {
      printf("Input Error");
    }
    else if (obj->sarimax->retval == 1) {
      printf("Probable Success");
    }
    else if (obj->sarimax->retval == 4) {
      printf("Optimization Routine didn\'t converge");
    }
    else if (obj->sarimax->retval == 7) {
      printf("Exogenous Variables are collinear");
    }
    else if (obj->sarimax->retval == 10) {
      printf("Nonstationary AR part");
    }
    else if (obj->sarimax->retval == 0xc) {
      printf("Nonstationary Seasonal AR part");
    }
    else if (obj->sarimax->retval == 0xf) {
      printf("Optimization Routine Encountered Inf/Nan Values");
    }
  }
  printf("\n\n");
  printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",(ulong)(uint)obj->sarimax->p,
         (ulong)(uint)obj->sarimax->d,(ulong)(uint)obj->sarimax->q,(ulong)(uint)obj->sarimax->P,
         (ulong)(uint)obj->sarimax->D,obj->sarimax->Q);
  printf("\n");
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  for (t = 0; t < obj->sarimax->p; t = t + 1) {
    dVar1 = obj->sarimax->phi[t];
    dVar7 = sqrt(obj->sarimax->vcov[t + iVar4 * t]);
    printf("AR%-15d%-20g%-20g \n",dVar1,SUB84(dVar7,0),(ulong)(t + 1));
  }
  for (t = 0; t < obj->sarimax->q; t = t + 1) {
    iVar5 = obj->sarimax->p + t;
    dVar1 = obj->sarimax->theta[t];
    dVar7 = sqrt(obj->sarimax->vcov[iVar5 + iVar4 * iVar5]);
    printf("MA%-15d%-20g%-20g \n",dVar1,SUB84(dVar7,0),(ulong)(t + 1));
  }
  for (t = 0; t < obj->sarimax->P; t = t + 1) {
    iVar5 = obj->sarimax->p + obj->sarimax->q + t;
    dVar1 = obj->sarimax->PHI[t];
    dVar7 = sqrt(obj->sarimax->vcov[iVar5 + iVar4 * iVar5]);
    printf("SAR%-14d%-20g%-20g \n",dVar1,SUB84(dVar7,0),(ulong)(t + 1));
  }
  for (t = 0; t < obj->sarimax->Q; t = t + 1) {
    iVar5 = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + t;
    dVar1 = obj->sarimax->THETA[t];
    dVar7 = sqrt(obj->sarimax->vcov[iVar5 + iVar4 * iVar5]);
    printf("SMA%-14d%-20g%-20g \n",dVar1,SUB84(dVar7,0),(ulong)(t + 1));
  }
  printf("\n");
  ncxreg = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + obj->sarimax->Q;
  if (iVar2 - iVar3 < 1) {
    printf("%-17s%-20g \n",obj->sarimax->mean,"MEAN");
  }
  else {
    dVar1 = obj->sarimax->mean;
    dVar7 = sqrt(obj->sarimax->vcov[ncxreg + iVar4 * ncxreg]);
    printf("%-17s%-20g%-20g \n",dVar1,SUB84(dVar7,0),"MEAN");
    ncxreg = ncxreg + 1;
  }
  bVar6 = obj->idrift != 1;
  if (bVar6) {
    printf("%-17s%-20g \n",0,"TREND");
  }
  else {
    dVar1 = *obj->sarimax->exog;
    dVar7 = sqrt(obj->sarimax->vcov[ncxreg + iVar4 * ncxreg]);
    printf("%-17s%-20g%-20g \n",dVar1,SUB84(dVar7,0),"TREND");
    ncxreg = ncxreg + 1;
  }
  local_24 = (uint)!bVar6;
  for (t = local_24; t < obj->sarimax->r; t = t + 1) {
    dVar1 = obj->sarimax->exog[t];
    dVar7 = sqrt(obj->sarimax->vcov[ncxreg + iVar4 * ncxreg]);
    printf("%-17s%-20g%-20g \n",dVar1,SUB84(dVar7,0),"EXOG");
    ncxreg = ncxreg + 1;
  }
  printf("\n");
  printf("%-17s%-20g \n",obj->sigma2,"SIGMA^2");
  printf("\n");
  printf("ESTIMATION METHOD : ");
  if (obj->sarimax->method == 0) {
    printf("CSS-MLE");
  }
  else if (obj->sarimax->method == 1) {
    printf("MLE");
  }
  else if (obj->sarimax->method == 2) {
    printf("CSS");
  }
  printf("\n\n");
  printf("OPTIMIZATION METHOD : ");
  if (obj->sarimax->optmethod == 0) {
    printf("Nelder-Mead");
  }
  else if (obj->sarimax->optmethod == 1) {
    printf("Newton Line Search");
  }
  else if (obj->sarimax->optmethod == 2) {
    printf("Newton Trust Region - Hook Step");
  }
  else if (obj->sarimax->optmethod == 3) {
    printf("Newton Trust Region - Double Dog-Leg");
  }
  else if (obj->sarimax->optmethod == 4) {
    printf("Conjugate Gradient");
  }
  else if (obj->sarimax->optmethod == 5) {
    printf("BFGS");
  }
  else if (obj->sarimax->optmethod == 6) {
    printf("L-BFGS");
  }
  else if (obj->sarimax->optmethod == 7) {
    printf("BFGS More-Thuente Line Search");
  }
  printf("\n\n");
  printf("AIC criterion : %g ",obj->aic);
  printf("\n\n");
  printf("BIC criterion : %g ",obj->bic);
  printf("\n\n");
  printf("AICC criterion : %g ",obj->aicc);
  printf("\n\n");
  if (((obj->sarimax->method == 0) || (obj->sarimax->method == 1)) || (obj->sarimax->method == 2)) {
    printf("Log Likelihood : %g ",obj->sarimax->loglik);
    printf("\n\n");
  }
  return;
}

Assistant:

void myarima_summary(myarima_object obj) {
	int i, pq,t,nd,ncxreg,mean;
	pq = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + obj->sarimax->Q + obj->sarimax->M;
	mean = obj->sarimax->M - obj->sarimax->r;
	
	if (obj->sarimax->method == 0 || obj->sarimax->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->sarimax->retval);
		printf("Exit Message : ");

		if (obj->sarimax->retval == 0) {
			printf("Input Error");
		}
		else if (obj->sarimax->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->sarimax->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->sarimax->retval == 7) {
			printf("Exogenous Variables are collinear");
		}
		else if (obj->sarimax->retval == 10) {
			printf("Nonstationary AR part");
		}
		else if (obj->sarimax->retval == 12) {
			printf("Nonstationary Seasonal AR part");
		}
		else if (obj->sarimax->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",obj->sarimax->p,obj->sarimax->d,obj->sarimax->q,
	 obj->sarimax->P,obj->sarimax->D,obj->sarimax->Q );
	printf("\n");
	//mdisplay(obj->vcov,pq,pq);
	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->sarimax->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->sarimax->phi[i], sqrt(obj->sarimax->vcov[i + pq*i]));
	}
	for (i = 0; i < obj->sarimax->q; ++i) {
		t = obj->sarimax->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->sarimax->theta[i], sqrt(obj->sarimax->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->sarimax->P; ++i) {
		t = obj->sarimax->p + obj->sarimax->q + i;
		printf("SAR%-14d%-20g%-20g \n", i + 1, obj->sarimax->PHI[i], sqrt(obj->sarimax->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->sarimax->Q; ++i) {
		t = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + i;
		printf("SMA%-14d%-20g%-20g \n", i + 1, obj->sarimax->THETA[i], sqrt(obj->sarimax->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + obj->sarimax->Q;
	if (mean > 0) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->sarimax->mean, sqrt(obj->sarimax->vcov[t + pq * t]));
		t++;
		
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->sarimax->mean);
	}
	ncxreg = 0;
	if (obj->idrift == 1) {
		printf("%-17s%-20g%-20g \n", "TREND", obj->sarimax->exog[0], sqrt(obj->sarimax->vcov[t + pq * t]));
		t++;
		ncxreg++;
	} else {
		printf("%-17s%-20g \n", "TREND", 0.0);
	}
	for(i = ncxreg; i < obj->sarimax->r; ++i) {
		printf("%-17s%-20g%-20g \n", "EXOG", obj->sarimax->exog[i], sqrt(obj->sarimax->vcov[t + pq * t]));
		t++;
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->sigma2);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->sarimax->method == 0) {
		printf("CSS-MLE");
	}
	else if (obj->sarimax->method == 1) {
		printf("MLE");
	}
	else if (obj->sarimax->method == 2) {
		printf("CSS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	
	if (obj->sarimax->optmethod == 0) {
		printf("Nelder-Mead");
	}
	else if (obj->sarimax->optmethod == 1) {
		printf("Newton Line Search");
	}
	else if (obj->sarimax->optmethod == 2) {
		printf("Newton Trust Region - Hook Step");
	}
	else if (obj->sarimax->optmethod == 3) {
		printf("Newton Trust Region - Double Dog-Leg");
	}
	else if (obj->sarimax->optmethod == 4) {
		printf("Conjugate Gradient");
	}
	else if (obj->sarimax->optmethod == 5) {
		printf("BFGS");
	}
	else if (obj->sarimax->optmethod == 6) {
		printf("L-BFGS");
	}
	else if (obj->sarimax->optmethod == 7) {
		printf("BFGS More-Thuente Line Search");
	}
	
	printf("\n\n");
	
	printf("AIC criterion : %g ", obj->aic);
	printf("\n\n");
	printf("BIC criterion : %g ", obj->bic);
	printf("\n\n");
	printf("AICC criterion : %g ", obj->aicc);
	printf("\n\n");
	if (obj->sarimax->method == 0 || obj->sarimax->method == 1 || obj->sarimax->method == 2) {
		printf("Log Likelihood : %g ", obj->sarimax->loglik);
		printf("\n\n");
	}
}